

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<MaterialDataV,_10>::Resize(TPZManVector<MaterialDataV,_10> *this,int64_t newsize)

{
  undefined1 auVar1 [16];
  ostream *this_00;
  MaterialDataV *pMVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  MaterialDataV *pMVar6;
  long in_RSI;
  TPZManVector<MaterialDataV,_10> *in_RDI;
  ulong uVar7;
  int64_t i_1;
  MaterialDataV *newstore;
  int64_t realsize;
  int64_t i;
  MaterialDataV *in_stack_ffffffffffffff18;
  MaterialDataV *in_stack_ffffffffffffff20;
  MaterialDataV *this_01;
  MaterialDataV *in_stack_ffffffffffffff30;
  double dVar8;
  MaterialDataV *local_98;
  long local_40;
  long local_18;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<MaterialDataV>).fNElements) {
    if ((in_RDI->super_TPZVec<MaterialDataV>).fNAlloc < in_RSI) {
      if (in_RSI < 0xb) {
        if ((in_RDI->super_TPZVec<MaterialDataV>).fStore != in_RDI->fExtAlloc) {
          for (local_18 = 0; local_18 < (in_RDI->super_TPZVec<MaterialDataV>).fNElements;
              local_18 = local_18 + 1) {
            MaterialDataV::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          }
          pMVar6 = (in_RDI->super_TPZVec<MaterialDataV>).fStore;
          if (pMVar6 != (MaterialDataV *)0x0) {
            dVar8 = pMVar6[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc[9];
            for (pMVar2 = pMVar6 + (long)dVar8; pMVar6 != pMVar2; pMVar2 = pMVar2 + -1) {
              MaterialDataV::~MaterialDataV(in_stack_ffffffffffffff20);
            }
            operator_delete__(pMVar6[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc + 9,
                              (long)dVar8 * 0x98 + 8);
          }
          (in_RDI->super_TPZVec<MaterialDataV>).fStore = in_RDI->fExtAlloc;
        }
        (in_RDI->super_TPZVec<MaterialDataV>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<MaterialDataV>).fNAlloc = 0;
      }
      else {
        uVar3 = ExpandSize(in_RDI,in_RSI);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar3;
        uVar4 = SUB168(auVar1 * ZEXT816(0x98),0);
        uVar7 = uVar4 + 8;
        if (SUB168(auVar1 * ZEXT816(0x98),8) != 0 || 0xfffffffffffffff7 < uVar4) {
          uVar7 = 0xffffffffffffffff;
        }
        puVar5 = (ulong *)operator_new__(uVar7);
        *puVar5 = uVar3;
        pMVar6 = (MaterialDataV *)(puVar5 + 1);
        if (uVar3 != 0) {
          local_98 = pMVar6;
          do {
            MaterialDataV::MaterialDataV(in_stack_ffffffffffffff30);
            local_98 = local_98 + 1;
          } while (local_98 != pMVar6 + uVar3);
        }
        for (local_40 = 0; local_40 < (in_RDI->super_TPZVec<MaterialDataV>).fNElements;
            local_40 = local_40 + 1) {
          MaterialDataV::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        }
        if (((in_RDI->super_TPZVec<MaterialDataV>).fStore != in_RDI->fExtAlloc) &&
           (pMVar2 = (in_RDI->super_TPZVec<MaterialDataV>).fStore, pMVar2 != (MaterialDataV *)0x0))
        {
          dVar8 = pMVar2[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc[9];
          this_01 = pMVar2 + (long)dVar8;
          while (pMVar2 != this_01) {
            this_01 = this_01 + -1;
            MaterialDataV::~MaterialDataV(this_01);
          }
          operator_delete__(pMVar2[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc + 9,
                            (long)dVar8 * 0x98 + 8);
        }
        (in_RDI->super_TPZVec<MaterialDataV>).fStore = pMVar6;
        (in_RDI->super_TPZVec<MaterialDataV>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<MaterialDataV>).fNAlloc = uVar3;
      }
    }
    else {
      (in_RDI->super_TPZVec<MaterialDataV>).fNElements = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}